

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

result_type __thiscall
WellTestCase<Well<unsigned_int,_32UL,_32UL,_0UL,_22UL,_25UL,_26UL,_Detail::M3<-21>,_Detail::M3<17>,_Detail::M4<2346498334U>,_Detail::M3<15>,_Detail::M3<-14>,_Detail::M3<-21>,_Detail::M1,_Detail::M0,_Detail::NoTempering>,_2256501139U>
::generate(WellTestCase<Well<unsigned_int,_32UL,_32UL,_0UL,_22UL,_25UL,_26UL,_Detail::M3<_21>,_Detail::M3<17>,_Detail::M4<2346498334U>,_Detail::M3<15>,_Detail::M3<_14>,_Detail::M3<_21>,_Detail::M1,_Detail::M0,_Detail::NoTempering>,_2256501139U>
           *this)

{
  result_type rVar1;
  long lVar2;
  uint uVar3;
  uint *p;
  uint state [32];
  uint *local_a0;
  uint local_98 [32];
  uint local_18 [2];
  
  lVar2 = 0;
  do {
    *(undefined4 *)((long)local_98 + lVar2) = 1;
    lVar2 = lVar2 + 4;
  } while (lVar2 != 0x80);
  local_a0 = local_98;
  Well<unsigned_int,32ul,32ul,0ul,22ul,25ul,26ul,Detail::M3<-21>,Detail::M3<17>,Detail::M4<2346498334u>,Detail::M3<15>,Detail::M3<-14>,Detail::M3<-21>,Detail::M1,Detail::M0,Detail::NoTempering>
  ::seed<unsigned_int*>
            ((Well<unsigned_int,32ul,32ul,0ul,22ul,25ul,26ul,Detail::M3<_21>,Detail::M3<17>,Detail::M4<2346498334u>,Detail::M3<15>,Detail::M3<_14>,Detail::M3<_21>,Detail::M1,Detail::M0,Detail::NoTempering>
              *)this,&local_a0,local_18);
  uVar3 = 0x3b9aca01;
  do {
    rVar1 = Well<unsigned_int,_32UL,_32UL,_0UL,_22UL,_25UL,_26UL,_Detail::M3<-21>,_Detail::M3<17>,_Detail::M4<2346498334U>,_Detail::M3<15>,_Detail::M3<-14>,_Detail::M3<-21>,_Detail::M1,_Detail::M0,_Detail::NoTempering>
            ::operator()(&this->rng);
    uVar3 = uVar3 - 1;
  } while (1 < uVar3);
  return rVar1;
}

Assistant:

result_type generate()
    {
        unsigned state[RandomNumberGenerator::state_size];
        std::uninitialized_fill_n(state, RandomNumberGenerator::state_size, 1);

        unsigned* p = state;
        rng.seed(p, p + RandomNumberGenerator::state_size);

        result_type x = 0;

        int iterations = 1000000000;

        while (iterations-- > 0)
            x = rng();

        return x;
    }